

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SHA1_Hash *
Internal_VertexHash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDHashType hash_type,
                   ON_SubDVertex *first_vertex,uint level_index,ON_SubDVertexIdIterator *vidit)

{
  uint uVar1;
  ON_SubDVertex *v;
  undefined7 in_register_00000031;
  ON_SHA1 local_b8;
  
  local_b8.m_state[2] = 0;
  local_b8.m_state[3] = 0;
  local_b8.m_state[4] = 0;
  local_b8.m_bit_count[0] = 0;
  local_b8.m_bit_count[1] = 0;
  local_b8.m_state[0] = 0;
  local_b8.m_state[1] = 0;
  local_b8.m_buffer[0x30] = '\0';
  local_b8.m_buffer[0x31] = '\0';
  local_b8.m_buffer[0x32] = '\0';
  local_b8.m_buffer[0x33] = '\0';
  local_b8.m_buffer[0x34] = '\0';
  local_b8.m_buffer[0x35] = '\0';
  local_b8.m_buffer[0x36] = '\0';
  local_b8.m_buffer[0x37] = '\0';
  local_b8.m_buffer[0x38] = '\0';
  local_b8.m_buffer[0x39] = '\0';
  local_b8.m_buffer[0x3a] = '\0';
  local_b8.m_buffer[0x3b] = '\0';
  local_b8.m_buffer[0x3c] = '\0';
  local_b8.m_buffer[0x3d] = '\0';
  local_b8.m_buffer[0x3e] = '\0';
  local_b8.m_buffer[0x3f] = '\0';
  local_b8.m_buffer[0x20] = '\0';
  local_b8.m_buffer[0x21] = '\0';
  local_b8.m_buffer[0x22] = '\0';
  local_b8.m_buffer[0x23] = '\0';
  local_b8.m_buffer[0x24] = '\0';
  local_b8.m_buffer[0x25] = '\0';
  local_b8.m_buffer[0x26] = '\0';
  local_b8.m_buffer[0x27] = '\0';
  local_b8.m_buffer[0x28] = '\0';
  local_b8.m_buffer[0x29] = '\0';
  local_b8.m_buffer[0x2a] = '\0';
  local_b8.m_buffer[0x2b] = '\0';
  local_b8.m_buffer[0x2c] = '\0';
  local_b8.m_buffer[0x2d] = '\0';
  local_b8.m_buffer[0x2e] = '\0';
  local_b8.m_buffer[0x2f] = '\0';
  local_b8.m_buffer[0x10] = '\0';
  local_b8.m_buffer[0x11] = '\0';
  local_b8.m_buffer[0x12] = '\0';
  local_b8.m_buffer[0x13] = '\0';
  local_b8.m_buffer[0x14] = '\0';
  local_b8.m_buffer[0x15] = '\0';
  local_b8.m_buffer[0x16] = '\0';
  local_b8.m_buffer[0x17] = '\0';
  local_b8.m_buffer[0x18] = '\0';
  local_b8.m_buffer[0x19] = '\0';
  local_b8.m_buffer[0x1a] = '\0';
  local_b8.m_buffer[0x1b] = '\0';
  local_b8.m_buffer[0x1c] = '\0';
  local_b8.m_buffer[0x1d] = '\0';
  local_b8.m_buffer[0x1e] = '\0';
  local_b8.m_buffer[0x1f] = '\0';
  local_b8.m_buffer[0] = '\0';
  local_b8.m_buffer[1] = '\0';
  local_b8.m_buffer[2] = '\0';
  local_b8.m_buffer[3] = '\0';
  local_b8.m_buffer[4] = '\0';
  local_b8.m_buffer[5] = '\0';
  local_b8.m_buffer[6] = '\0';
  local_b8.m_buffer[7] = '\0';
  local_b8.m_buffer[8] = '\0';
  local_b8.m_buffer[9] = '\0';
  local_b8.m_buffer[10] = '\0';
  local_b8.m_buffer[0xb] = '\0';
  local_b8.m_buffer[0xc] = '\0';
  local_b8.m_buffer[0xd] = '\0';
  local_b8.m_buffer[0xe] = '\0';
  local_b8.m_buffer[0xf] = '\0';
  local_b8.m_byte_count = 0;
  local_b8.m_status_bits = 0;
  local_b8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_b8.m_sha1_hash);
  if (first_vertex != (ON_SubDVertex *)0x0 && (int)CONCAT71(in_register_00000031,hash_type) != 0) {
    uVar1 = 0;
    do {
      if ((first_vertex->super_ON_SubDComponentBase).m_id < uVar1) {
        ON_SHA1::Reset(&local_b8);
        v = ON_SubDVertexIdIterator::FirstVertex(vidit);
        while (v != (ON_SubDVertex *)0x0) {
          if ((((v->super_ON_SubDComponentBase).m_level == level_index) &&
              ((v->super_ON_SubDComponentBase).m_id != 0)) &&
             ((v->super_ON_SubDComponentBase).m_archive_id != 0xffffffff)) {
            Internal_AccumulateVertexHash(&local_b8,hash_type,v);
          }
          v = ON_SubDVertexIdIterator::NextVertex(vidit);
        }
        break;
      }
      Internal_AccumulateVertexHash(&local_b8,hash_type,first_vertex);
      uVar1 = (first_vertex->super_ON_SubDComponentBase).m_id;
      first_vertex = first_vertex->m_next_vertex;
    } while (first_vertex != (ON_SubDVertex *)0x0);
  }
  ON_SHA1::Hash(__return_storage_ptr__,&local_b8);
  return __return_storage_ptr__;
}

Assistant:

static const ON_SHA1_Hash Internal_VertexHash(ON_SubDHashType hash_type, const ON_SubDVertex* first_vertex, unsigned int level_index, ON_SubDVertexIdIterator& vidit)
{
  ON_SHA1 sha1;
  if (ON_SubDHashType::Unset != hash_type)
  {
    unsigned prev_id = 0;
    for (const ON_SubDVertex* v = first_vertex; nullptr != v; v = v->m_next_vertex)
    {
      if (prev_id > v->m_id)
      {
        // must use slower vidit to get consistent results when complex editing juggles vertex order
        sha1.Reset();
        for (v = vidit.FirstVertex(); nullptr != v; v = vidit.NextVertex())
        {
          if ( level_index == v->SubdivisionLevel() && v->IsActive() )
            Internal_AccumulateVertexHash(sha1, hash_type, v);
        }
        break;
      }
      Internal_AccumulateVertexHash(sha1, hash_type, v);
      prev_id = v->m_id;
    }
  }
  return sha1.Hash();
}